

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CEPlanet.cpp
# Opt level: O0

CEPlanet * CEPlanet::Pluto(void)

{
  CEPlanet *in_RDI;
  CEPlanet *pluto;
  CEPlanet *angle;
  CEPlanet *this;
  uint in_stack_ffffffffffffff80;
  CEAngle *ycoord;
  CEAngle *in_stack_ffffffffffffff90;
  string *in_stack_ffffffffffffff98;
  CEPlanet *this_00;
  undefined1 local_31 [40];
  undefined1 local_9;
  
  local_9 = CIRS;
  this = (CEPlanet *)local_31;
  angle = in_RDI;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)(local_31 + 1),"Pluto",(allocator *)this);
  this_00 = (CEPlanet *)0x0;
  CEAngle::CEAngle((CEAngle *)this,(double *)angle);
  ycoord = (CEAngle *)0x0;
  CEAngle::CEAngle((CEAngle *)this,(double *)angle);
  CEPlanet(this_00,in_stack_ffffffffffffff98,in_stack_ffffffffffffff90,ycoord,
           (CESkyCoordType *)(ulong)in_stack_ffffffffffffff80);
  CEAngle::~CEAngle((CEAngle *)0x140af1);
  CEAngle::~CEAngle((CEAngle *)0x140afb);
  std::__cxx11::string::~string((string *)(local_31 + 1));
  std::allocator<char>::~allocator((allocator<char> *)local_31);
  SetSemiMajorAxis_AU(this,(double)angle,(double)in_RDI);
  SetEccentricity(in_RDI,0.24885238,6.016e-05);
  SetInclination(in_RDI,17.1410426,5.01e-06,DEGREES);
  SetMeanLongitude(in_RDI,238.96535011,145.18042903,DEGREES);
  SetPerihelionLongitude(in_RDI,224.09702598,-0.00968827,DEGREES);
  SetAscendingNodeLongitude(in_RDI,110.30167986,-0.00809981,DEGREES);
  SetExtraTerms(in_RDI,-0.01262724,0.0,0.0,0.0);
  SetMeanRadius_m(in_RDI,1195000.0);
  SetAlbedo(in_RDI,0.3);
  SetMass_kg(in_RDI,1.307e+22);
  SetSofaID(this,(double *)angle);
  return angle;
}

Assistant:

CEPlanet CEPlanet::Pluto()
{
    CEPlanet pluto("Pluto", 0.0, 0.0) ;
    pluto.SetSemiMajorAxis_AU(39.48686035, 0.00449751) ;
    pluto.SetEccentricity(0.24885238, 0.00006016) ;
    pluto.SetInclination(17.14104260, 0.00000501, CEAngleType::DEGREES) ;
    pluto.SetMeanLongitude(238.96535011, 145.18042903, CEAngleType::DEGREES) ;
    pluto.SetPerihelionLongitude(224.09702598, -0.00968827, CEAngleType::DEGREES) ;
    pluto.SetAscendingNodeLongitude(110.30167986, -0.00809981, CEAngleType::DEGREES) ;
    
    pluto.SetExtraTerms(-0.01262724, 0.0, 0.0, 0.0) ;
    
    // Set planetary properties
    pluto.SetMeanRadius_m(1195000.0) ;
    pluto.SetAlbedo(0.3) ;
    pluto.SetMass_kg(1.307E22) ;
    
    // Set the sofa planet ID
    // Note that Pluto's positions cannot be computed via the SOFA method
    pluto.SetSofaID(9) ;
    
    return pluto ;
}